

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O3

void wwSetBits(word *a,size_t pos,size_t width,word val)

{
  sbyte sVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = pos >> 6;
  uVar4 = 0xffffffffffffffff >> (-(char)width & 0x3fU);
  if (0x3f < width) {
    uVar4 = 0xffffffffffffffff;
  }
  uVar2 = (uint)pos & 0x3f;
  sVar1 = (sbyte)uVar2;
  a[uVar3] = (uVar4 & val) << sVar1 ^ ~(uVar4 << sVar1) & a[uVar3];
  if (0x40 < width + uVar2) {
    a[uVar3 + 1] = (uVar4 & val) >> (-sVar1 & 0x3fU) ^ uVar4 << sVar1 & a[uVar3 + 1];
  }
  return;
}

Assistant:

void wwSetBits(word a[], size_t pos, size_t width, register word val)
{
	word mask = WORD_MAX;
	size_t n = pos / B_PER_W;
	ASSERT(wwIsValid(a, W_OF_B(pos + width)));
	ASSERT(width <= B_PER_W);
	// маска
	if (width < B_PER_W)
	{
		mask <<= B_PER_W - width;
		mask >>= B_PER_W - width;
	}
	// биты a[n]
	pos %= B_PER_W;
	a[n] &= ~(mask << pos);
	a[n] ^= (val & mask) << pos;
	// биты a[n + 1]
	if (pos + width > B_PER_W)
	{
		a[n + 1] &= mask << pos;
		a[n + 1] ^= (val & mask) >> (B_PER_W - pos);
	}
}